

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

void TransformWHT_C(int16_t *in,int16_t *out)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int a3_1;
  int a2_1;
  int a1_1;
  int a0_1;
  int dc;
  int a3;
  int a2;
  int a1;
  int a0;
  int i;
  int tmp [16];
  int16_t *local_10;
  int16_t *out_local;
  
  for (a1 = 0; a1 < 4; a1 = a1 + 1) {
    sVar1 = in[a1];
    sVar2 = in[a1 + 0xc];
    sVar3 = in[a1 + 4];
    sVar4 = in[a1 + 8];
    sVar5 = in[a1 + 4];
    sVar6 = in[a1 + 8];
    sVar7 = in[a1];
    sVar8 = in[a1 + 0xc];
    (&a0)[a1] = (int)sVar1 + (int)sVar2 + (int)sVar3 + (int)sVar4;
    (&a0)[a1 + 8] = ((int)sVar1 + (int)sVar2) - ((int)sVar3 + (int)sVar4);
    (&a0)[a1 + 4] = ((int)sVar7 - (int)sVar8) + ((int)sVar5 - (int)sVar6);
    (&a0)[a1 + 0xc] = ((int)sVar7 - (int)sVar8) - ((int)sVar5 - (int)sVar6);
  }
  local_10 = out;
  for (a1 = 0; a1 < 4; a1 = a1 + 1) {
    iVar13 = (&a0)[a1 << 2] + 3 + (&a0)[a1 * 4 + 3];
    iVar9 = (&a0)[a1 * 4 + 1];
    iVar10 = (&a0)[a1 * 4 + 2];
    iVar11 = (&a0)[a1 * 4 + 1];
    iVar12 = (&a0)[a1 * 4 + 2];
    iVar14 = ((&a0)[a1 << 2] + 3) - (&a0)[a1 * 4 + 3];
    *local_10 = (int16_t)(iVar13 + iVar9 + iVar10 >> 3);
    local_10[0x10] = (int16_t)(iVar14 + (iVar11 - iVar12) >> 3);
    local_10[0x20] = (int16_t)(iVar13 - (iVar9 + iVar10) >> 3);
    local_10[0x30] = (int16_t)(iVar14 - (iVar11 - iVar12) >> 3);
    local_10 = local_10 + 0x40;
  }
  return;
}

Assistant:

static void TransformWHT_C(const int16_t* WEBP_RESTRICT in,
                           int16_t* WEBP_RESTRICT out) {
  int tmp[16];
  int i;
  for (i = 0; i < 4; ++i) {
    const int a0 = in[0 + i] + in[12 + i];
    const int a1 = in[4 + i] + in[ 8 + i];
    const int a2 = in[4 + i] - in[ 8 + i];
    const int a3 = in[0 + i] - in[12 + i];
    tmp[0  + i] = a0 + a1;
    tmp[8  + i] = a0 - a1;
    tmp[4  + i] = a3 + a2;
    tmp[12 + i] = a3 - a2;
  }
  for (i = 0; i < 4; ++i) {
    const int dc = tmp[0 + i * 4] + 3;    // w/ rounder
    const int a0 = dc             + tmp[3 + i * 4];
    const int a1 = tmp[1 + i * 4] + tmp[2 + i * 4];
    const int a2 = tmp[1 + i * 4] - tmp[2 + i * 4];
    const int a3 = dc             - tmp[3 + i * 4];
    out[ 0] = (a0 + a1) >> 3;
    out[16] = (a3 + a2) >> 3;
    out[32] = (a0 - a1) >> 3;
    out[48] = (a3 - a2) >> 3;
    out += 64;
  }
}